

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
cppcms::util::urlencode_impl<std::ostreambuf_iterator<char,std::char_traits<char>>>
          (util *this,char *b,char *e,ostreambuf_iterator<char,_std::char_traits<char>_> out)

{
  util uVar1;
  int iVar2;
  uint uVar4;
  uint uVar5;
  long lVar3;
  
  if (this != (util *)b) {
    uVar4 = (uint)out._M_sbuf;
    do {
      uVar1 = *this;
      uVar5 = (uint)(byte)uVar1;
      if (((((byte)((char)uVar1 - 0x30U) < 10) || ((byte)(((byte)uVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          ((byte)uVar1 - 0x2d < 2)) || ((uVar1 == (util)0x7e || (uVar1 == (util)0x5f)))) {
        if ((uVar4 & 1) == 0) {
          if (*(util **)(e + 0x30) <= *(util **)(e + 0x28)) {
            lVar3 = *(long *)e;
            goto LAB_001e599e;
          }
          **(util **)(e + 0x28) = uVar1;
LAB_001e5933:
          *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
        }
      }
      else {
        if ((uVar4 & 1) == 0) {
          if (*(undefined1 **)(e + 0x28) < *(undefined1 **)(e + 0x30)) {
            **(undefined1 **)(e + 0x28) = 0x25;
            *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)e + 0x68))(e,0x25);
            uVar4 = uVar4 & 0xff;
            if (iVar2 == -1) {
              uVar4 = 1;
            }
          }
        }
        if ((uVar4 & 1) == 0) {
          if (*(char **)(e + 0x28) < *(char **)(e + 0x30)) {
            **(char **)(e + 0x28) = "0123456789abcdef"[(byte)uVar1 >> 4];
            *(long *)(e + 0x28) = *(long *)(e + 0x28) + 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)e + 0x68))(e,"0123456789abcdef"[(byte)uVar1 >> 4]);
            uVar4 = uVar4 & 0xff;
            if (iVar2 == -1) {
              uVar4 = 1;
            }
          }
        }
        if ((uVar4 & 1) == 0) {
          if (*(byte **)(e + 0x28) < *(byte **)(e + 0x30)) {
            **(byte **)(e + 0x28) = "0123456789abcdef"[uVar5 & 0xf];
            goto LAB_001e5933;
          }
          uVar5 = (uint)(byte)"0123456789abcdef"[uVar5 & 0xf];
          lVar3 = *(long *)e;
LAB_001e599e:
          iVar2 = (**(code **)(lVar3 + 0x68))(e,uVar5);
          uVar4 = uVar4 & 0xff;
          if (iVar2 == -1) {
            uVar4 = 1;
          }
        }
      }
      this = this + 1;
    } while (this != (util *)b);
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}